

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_1720d61::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  Value *pVVar1;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  CodemodelConfig *local_18;
  CodemodelConfig *this_local;
  Value *configuration;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CodemodelConfig *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_48,this->Config);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  ProcessDirectories(this);
  DumpTargets(&local_80,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"targets");
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  DumpDirectories(&local_a8,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"directories");
  Json::Value::operator=(pVVar1,&local_a8);
  Json::Value::~Value(&local_a8);
  DumpProjects(&local_d0,this);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"projects");
  Json::Value::operator=(pVVar1,&local_d0);
  Json::Value::~Value(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}